

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launchByAssociation.h
# Opt level: O3

int util::launchByAssociation(string *location)

{
  int iVar1;
  ostream *poVar2;
  ostringstream cmd;
  long *local_1a8;
  long local_198 [2];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  if (launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&launchByAssociation(std::__cxx11::string_const&)::
                                 LAUNCH_CMD_abi_cxx11_);
    if (iVar1 != 0) {
      launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_._M_dataplus._M_p =
           (pointer)&launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_.field_2
      ;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_,
                 "xdg-open ","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_);
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_188,
                      launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_.
                      _M_dataplus._M_p,
                      launchByAssociation(std::__cxx11::string_const&)::LAUNCH_CMD_abi_cxx11_.
                      _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(location->_M_dataplus)._M_p,location->_M_string_length);
  std::__cxx11::stringbuf::str();
  iVar1 = system((char *)local_1a8);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return iVar1;
}

Assistant:

int launchByAssociation(std::string const& location) {
#if defined(_WIN32)
		static const std::string LAUNCH_CMD = "start \"launchByAssociation\" ";
#elif defined(__APPLE__)
		static const std::string LAUNCH_CMD = "open ";
#else
		// Assume we're on a freedesktop.org system with xdg-utils
		static const std::string LAUNCH_CMD = "xdg-open ";
#endif
		std::ostringstream cmd;
		cmd << LAUNCH_CMD << location;
		return system(cmd.str().c_str());
	}